

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O1

uint __thiscall
fmt::internal::PrintfFormatter<wchar_t>::parse_header
          (PrintfFormatter<wchar_t> *this,wchar_t **s,FormatSpec *spec)

{
  wchar_t wVar1;
  uint uVar2;
  uint uVar3;
  wchar_t *s_00;
  bool bVar4;
  FormatSpec *local_50;
  Arg local_48;
  
  wVar1 = **s;
  uVar2 = 0xffffffff;
  if ((uint)(wVar1 + L'\xffffffd0') < 10) {
    uVar2 = parse_nonnegative_int<wchar_t>(s);
    if (**s == L'$') {
      *s = *s + 1;
      bVar4 = true;
    }
    else {
      if (wVar1 == L'0') {
        (spec->super_AlignSpec).super_WidthSpec.fill_ = L'0';
      }
      bVar4 = uVar2 == 0;
      if (!bVar4) {
        (spec->super_AlignSpec).super_WidthSpec.width_ = uVar2;
      }
      uVar2 = 0xffffffff;
    }
    if (!bVar4) {
      return 0xffffffff;
    }
  }
  parse_flags(this,spec,s);
  wVar1 = **s;
  if ((uint)(wVar1 + L'\xffffffd0') < 10) {
    uVar3 = parse_nonnegative_int<wchar_t>(s);
  }
  else {
    if (wVar1 != L'*') {
      return uVar2;
    }
    s_00 = *s + 1;
    *s = s_00;
    local_50 = spec;
    get_arg(&local_48,this,s_00,0xffffffff);
    uVar3 = ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int>::visit
                      ((ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)
                       &local_50,&local_48);
  }
  (spec->super_AlignSpec).super_WidthSpec.width_ = uVar3;
  return uVar2;
}

Assistant:

unsigned fmt::internal::PrintfFormatter<Char>::parse_header(
  const Char *&s, FormatSpec &spec) {
  unsigned arg_index = UINT_MAX;
  Char c = *s;
  if (c >= '0' && c <= '9') {
    // Parse an argument index (if followed by '$') or a width possibly
    // preceded with '0' flag(s).
    unsigned value = parse_nonnegative_int(s);
    if (*s == '$') {  // value is an argument index
      ++s;
      arg_index = value;
    } else {
      if (c == '0')
        spec.fill_ = '0';
      if (value != 0) {
        // Nonzero value means that we parsed width and don't need to
        // parse it or flags again, so return now.
        spec.width_ = value;
        return arg_index;
      }
    }
  }
  parse_flags(spec, s);
  // Parse width.
  if (*s >= '0' && *s <= '9') {
    spec.width_ = parse_nonnegative_int(s);
  } else if (*s == '*') {
    ++s;
    spec.width_ = fmt::WidthHandler(spec).visit(get_arg(s));
  }
  return arg_index;
}